

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int cvNlsInit(CVodeMem cvode_mem)

{
  int iVar1;
  CVodeMem in_RDI;
  int retval;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_RDI->cv_lsetup ==
      (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector *)0x0) {
    iVar1 = SUNNonlinSolSetLSetupFn
                      ((SUNNonlinearSolver)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                       (SUNNonlinSolLSetupFn)0x119d15b);
  }
  else {
    iVar1 = SUNNonlinSolSetLSetupFn
                      ((SUNNonlinearSolver)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                       (SUNNonlinSolLSetupFn)0x119d140);
  }
  if (iVar1 == 0) {
    if (in_RDI->cv_lsolve == (_func_int_CVodeMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector *)0x0) {
      iVar1 = SUNNonlinSolSetLSolveFn
                        ((SUNNonlinearSolver)(ulong)in_stack_ffffffffffffffe8,
                         (SUNNonlinSolLSolveFn)0x119d1db);
    }
    else {
      iVar1 = SUNNonlinSolSetLSolveFn
                        ((SUNNonlinearSolver)(ulong)in_stack_ffffffffffffffe8,
                         (SUNNonlinSolLSolveFn)0x119d1c0);
    }
    if (iVar1 == 0) {
      iVar1 = SUNNonlinSolInitialize((SUNNonlinearSolver)in_RDI);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        cvProcessError(in_RDI,-0x16,"CVODE","cvNlsInit",
                       "The nonlinear solver\'s init routine failed.");
        local_4 = -0xd;
      }
    }
    else {
      cvProcessError(in_RDI,-0x16,"CVODE","cvNlsInit","Setting linear solver solve function failed")
      ;
      local_4 = -0xd;
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,"CVODE","cvNlsInit",
                   "Setting the linear solver setup function failed");
    local_4 = -0xd;
  }
  return local_4;
}

Assistant:

int cvNlsInit(CVodeMem cvode_mem)
{
  int retval;

  /* set the linear solver setup wrapper function */
  if (cvode_mem->cv_lsetup)
    retval = SUNNonlinSolSetLSetupFn(cvode_mem->NLS, cvNlsLSetup);
  else
    retval = SUNNonlinSolSetLSetupFn(cvode_mem->NLS, NULL);

  if (retval != CV_SUCCESS) {
    cvProcessError(cvode_mem, CV_ILL_INPUT, "CVODE", "cvNlsInit",
                   "Setting the linear solver setup function failed");
    return(CV_NLS_INIT_FAIL);
  }

  /* set the linear solver solve wrapper function */
  if (cvode_mem->cv_lsolve)
    retval = SUNNonlinSolSetLSolveFn(cvode_mem->NLS, cvNlsLSolve);
  else
    retval = SUNNonlinSolSetLSolveFn(cvode_mem->NLS, NULL);

  if (retval != CV_SUCCESS) {
    cvProcessError(cvode_mem, CV_ILL_INPUT, "CVODE", "cvNlsInit",
                   "Setting linear solver solve function failed");
    return(CV_NLS_INIT_FAIL);
  }

  /* initialize nonlinear solver */
  retval = SUNNonlinSolInitialize(cvode_mem->NLS);

  if (retval != CV_SUCCESS) {
    cvProcessError(cvode_mem, CV_ILL_INPUT, "CVODE", "cvNlsInit",
                   MSGCV_NLS_INIT_FAIL);
    return(CV_NLS_INIT_FAIL);
  }

  return(CV_SUCCESS);
}